

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O3

string * __thiscall
amrex::get_command_argument_abi_cxx11_(string *__return_storage_ptr__,amrex *this,int number)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = ::(anonymous_namespace)::command_arguments_abi_cxx11_;
  if ((int)this <
      (int)((ulong)(_DAT_008165b0 - ::(anonymous_namespace)::command_arguments_abi_cxx11_) >> 5)) {
    lVar3 = (long)(int)this * 0x20;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar1 = *(long *)(lVar2 + lVar3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar1,*(long *)(lVar2 + 8 + lVar3) + lVar1);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
amrex::get_command_argument (int number)
{
    if (number < static_cast<int>(command_arguments.size())) {
        return command_arguments[number];
    } else {
        return std::string();
    }
}